

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lysp_stmt_type_enum_value_pos
                 (lysp_ctx *ctx,lysp_stmt *stmt,int64_t *value,uint16_t *flags,
                 lysp_ext_instance **exts)

{
  char cVar1;
  LY_ERR LVar2;
  size_t sVar3;
  char *pcVar4;
  ulonglong uVar5;
  ulonglong uVar6;
  char *pcVar7;
  char *format;
  ly_stmt insubstmt;
  ly_ctx *plVar8;
  int iVar9;
  lysp_stmt *stmt_00;
  char *ptr;
  char *local_40;
  int *local_38;
  
  local_40 = (char *)0x0;
  if ((*flags >> 9 & 1) != 0) {
    if (ctx == (lysp_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar7 = lyplg_ext_stmt2str(stmt->kw);
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".",pcVar7);
    return LY_EVALID;
  }
  *flags = *flags | 0x200;
  LVar2 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  pcVar7 = stmt->arg;
  sVar3 = strlen(pcVar7);
  iVar9 = (int)sVar3;
  if ((((iVar9 == 0) || (cVar1 = *pcVar7, cVar1 == '+')) || (1 < iVar9 && cVar1 == '0')) ||
     ((cVar1 == '-' && stmt->kw == LY_STMT_POSITION && (pcVar7[1] == '0')))) {
LAB_0016dffa:
    if (ctx == (lysp_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar4 = lyplg_ext_stmt2str(stmt->kw);
    format = "Invalid value \"%.*s\" of \"%s\".";
  }
  else {
    local_38 = __errno_location();
    *local_38 = 0;
    if (stmt->kw == LY_STMT_VALUE) {
      uVar5 = strtoll(pcVar7,&local_40,10);
      if ((long)(int)uVar5 == uVar5) {
        uVar6 = 0;
LAB_0016e131:
        pcVar7 = stmt->arg;
        if ((long)local_40 - (long)pcVar7 == (long)iVar9) {
          if (*local_38 != 0x22) {
            if (stmt->kw == LY_STMT_VALUE) {
              uVar6 = uVar5;
            }
            *value = uVar6;
            stmt_00 = stmt->child;
            if (stmt_00 != (lysp_stmt *)0x0) {
              while( true ) {
                if (stmt_00->kw != LY_STMT_EXTENSION_INSTANCE) {
                  if (ctx == (lysp_ctx *)0x0) {
                    plVar8 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar8 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  }
                  pcVar7 = lyplg_ext_stmt2str(stmt_00->kw);
                  pcVar4 = lyplg_ext_stmt2str(stmt->kw);
                  ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,
                          "Invalid keyword \"%s\" as a child of \"%s\".",pcVar7,pcVar4);
                  return LY_EVALID;
                }
                insubstmt = stmt->kw;
                if (insubstmt != LY_STMT_VALUE) {
                  insubstmt = LY_STMT_POSITION;
                }
                LVar2 = lysp_stmt_ext(ctx,stmt_00,insubstmt,0,exts);
                if (LVar2 != LY_SUCCESS) break;
                stmt_00 = stmt_00->next;
                if (stmt_00 == (lysp_stmt *)0x0) {
                  return LY_SUCCESS;
                }
              }
              return LVar2;
            }
            return LY_SUCCESS;
          }
          if (ctx == (lysp_ctx *)0x0) {
            plVar8 = (ly_ctx *)0x0;
          }
          else {
            plVar8 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar4 = lyplg_ext_stmt2str(stmt->kw);
          format = "Value \"%.*s\" is out of \"%s\" bounds.";
          goto LAB_0016e084;
        }
        goto LAB_0016dffa;
      }
    }
    else {
      uVar6 = strtoull(pcVar7,&local_40,10);
      if (uVar6 >> 0x20 == 0) {
        uVar5 = 0;
        goto LAB_0016e131;
      }
    }
    if (ctx == (lysp_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar7 = stmt->arg;
    pcVar4 = lyplg_ext_stmt2str(stmt->kw);
    format = "Invalid value \"%.*s\" of \"%s\".";
  }
LAB_0016e084:
  ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,sVar3 & 0xffffffff,pcVar7,pcVar4);
  return LY_EVALID;
}

Assistant:

static LY_ERR
lysp_stmt_type_enum_value_pos(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, int64_t *value, uint16_t *flags,
        struct lysp_ext_instance **exts)
{
    int arg_len;
    char *ptr = NULL;
    long long num = 0;
    unsigned long long unum = 0;

    if (*flags & LYS_SET_VALUE) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(stmt->kw));
        return LY_EVALID;
    }
    *flags |= LYS_SET_VALUE;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));

    arg_len = strlen(stmt->arg);
    if (!arg_len || (stmt->arg[0] == '+') || ((stmt->arg[0] == '0') && (arg_len > 1)) ||
            ((stmt->kw == LY_STMT_POSITION) && !strncmp(stmt->arg, "-0", 2))) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, lyplg_ext_stmt2str(stmt->kw));
        goto error;
    }

    errno = 0;
    if (stmt->kw == LY_STMT_VALUE) {
        num = strtoll(stmt->arg, &ptr, LY_BASE_DEC);
        if ((num < INT64_C(-2147483648)) || (num > INT64_C(2147483647))) {
            LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, lyplg_ext_stmt2str(stmt->kw));
            goto error;
        }
    } else {
        unum = strtoull(stmt->arg, &ptr, LY_BASE_DEC);
        if (unum > UINT64_C(4294967295)) {
            LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, lyplg_ext_stmt2str(stmt->kw));
            goto error;
        }
    }
    /* we have not parsed the whole argument */
    if (ptr - stmt->arg != arg_len) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, lyplg_ext_stmt2str(stmt->kw));
        goto error;
    }
    if (errno == ERANGE) {
        LOGVAL_PARSER(ctx, LY_VCODE_OOB, arg_len, stmt->arg, lyplg_ext_stmt2str(stmt->kw));
        goto error;
    }
    if (stmt->kw == LY_STMT_VALUE) {
        *value = num;
    } else {
        *value = unum;
    }

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw == LY_STMT_VALUE ? LY_STMT_VALUE : LY_STMT_POSITION, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(stmt->kw));
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;

error:
    return LY_EVALID;
}